

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# query.h
# Opt level: O0

query<int,_std::vector<char,_std::allocator<char>_>_> * __thiscall
sqlib::query<int,_std::vector<char,_std::allocator<char>_>_>::operator++
          (query<int,_std::vector<char,_std::allocator<char>_>_> *this)

{
  undefined1 local_20 [8];
  column_extractor ex;
  query<int,_std::vector<char,_std::allocator<char>_>_> *this_local;
  
  ex.m_row = (row_type *)this;
  step(this);
  if ((this->m_has_data & 1U) != 0) {
    column_extractor::column_extractor
              ((column_extractor *)local_20,(this->super_statement_base).m_prepared,&this->m_row);
    ct_for<2,sqlib::query<int,std::vector<char,std::allocator<char>>>::column_extractor>
              ((column_extractor *)local_20);
  }
  return this;
}

Assistant:

query& operator++() {
    step();
    if(m_has_data) {
      column_extractor ex(m_prepared, m_row);
      ct_for<sizeof...(Cols)>(ex);
    }
    return *this;
  }